

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndividualBeliefJESP.cpp
# Opt level: O0

void __thiscall IndividualBeliefJESP::~IndividualBeliefJESP(IndividualBeliefJESP *this)

{
  IndividualBeliefJESP *in_RDI;
  
  ~IndividualBeliefJESP(in_RDI);
  operator_delete(in_RDI,0xa0);
  return;
}

Assistant:

IndividualBeliefJESP::~IndividualBeliefJESP()
{
    delete [] _m_stepsizeJOHOH;
    delete [] _m_stepsizeSJOH;
}